

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

void save_to_check_buffer_and_read_at_least_again
               (cio_buffered_stream *bs,void *context,cio_error err,cio_read_buffer *buffer,
               size_t num_bytes)

{
  cio_error cVar1;
  size_t num;
  char *second_chunk;
  size_t num_bytes_local;
  cio_read_buffer *buffer_local;
  cio_error err_local;
  void *context_local;
  cio_buffered_stream *bs_local;
  
  save_to_check_buffer(bs,context,err,buffer,num_bytes);
  num = strlen((char *)context);
  cVar1 = cio_buffered_stream_read_at_least(bs,buffer,num,second_dummy_read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Call to read_at_least did not succeed!",0x15e,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void save_to_check_buffer_and_read_at_least_again(struct cio_buffered_stream *bs, void *context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	char *second_chunk = context;

	save_to_check_buffer(bs, context, err, buffer, num_bytes);
	err = cio_buffered_stream_read_at_least(bs, buffer, strlen(second_chunk), second_dummy_read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Call to read_at_least did not succeed!");
}